

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O0

void __thiscall
ParameterReader::phraseOneLine(ParameterReader *this,string *str,string *commentSymbol)

{
  int iVar1;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000078;
  ParameterReader *in_stack_00000080;
  string *str_00;
  ParameterReader *in_stack_ffffffffffffff38;
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  string local_58;
  string local_38 [56];
  
  str_00 = &local_58;
  std::__cxx11::string::string((string *)str_00,in_RSI);
  AfterburnerUtil::trim(in_stack_ffffffffffffff78);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (iVar1 != 0) {
    std::__cxx11::string::string(local_a8,in_RSI);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff38,in_RDX);
    removeComments(in_stack_ffffffffffffff38,str_00,in_RDI);
    phraseEquationWithoutComments(in_stack_00000080,in_stack_00000078);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

void ParameterReader::phraseOneLine(string str, string commentSymbol) {
    /*
      Interpret a string like " x  = 1.1  #bla " to get the associated parameter
      name and value information, and put them into the internal variables
      "names" and "values".
    */
    if (trim(str).compare("") == 0) return;
    phraseEquationWithoutComments(removeComments(str, commentSymbol));
}